

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadBoundThreadContextManager.cpp
# Opt level: O3

void ThreadBoundThreadContextManager::DestroyContextAndEntryForCurrentThread(void)

{
  ThreadContext *threadContext;
  ThreadContextTLSEntry *local_18;
  ThreadContextTLSEntry *entry;
  
  CCLock::Enter(&ThreadContext::s_csThreadContext.super_CCLock);
  local_18 = ThreadContextTLSEntry::GetEntryForCurrentThread();
  if (local_18 != (ThreadContextTLSEntry *)0x0) {
    threadContext = ThreadContextTLSEntry::GetThreadContext(local_18);
    DListBase<ThreadContextTLSEntry_*,_RealCount>::Remove<Memory::HeapAllocator>
              (&entries.super_DListBase<ThreadContextTLSEntry_*,_RealCount>,entries.allocator,
               &local_18);
    if ((threadContext != (ThreadContext *)0x0) && (threadContext->isThreadBound == true)) {
      ThreadContextManagerBase::ShutdownThreadContext(threadContext,true);
    }
    ThreadContextTLSEntry::CleanupThread();
  }
  CCLock::Leave(&ThreadContext::s_csThreadContext.super_CCLock);
  return;
}

Assistant:

void ThreadBoundThreadContextManager::DestroyContextAndEntryForCurrentThread()
{
    AutoCriticalSection lock(ThreadContext::GetCriticalSection());

    ThreadContextTLSEntry * entry = ThreadContextTLSEntry::GetEntryForCurrentThread();

    if (entry == NULL)
    {
        return;
    }

    ThreadContext * threadContext = static_cast<ThreadContext *>(entry->GetThreadContext());
    entries.Remove(entry);

    if (threadContext != NULL && threadContext->IsThreadBound())
    {
        ShutdownThreadContext(threadContext);
    }

    ThreadContextTLSEntry::CleanupThread();
}